

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

void * tlsio_openssl_CloneOption(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar3;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  OPTION_OPENSSL_KEY_TYPE *value_clone_1;
  OPTION_OPENSSL_KEY_TYPE key_type_value;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  int *value_clone;
  LOGGER_LOG l_7;
  int int_value;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  void *result;
  void *value_local;
  char *name_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  result = value;
  value_local = name;
  if ((name == (char *)0x0) || (value == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_CloneOption",0x67,1,
                "invalid parameter detected: const char* name=%p, const void* value=%p",value_local,
                result);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    iVar1 = strcmp(name,"underlying_io_options");
    if (iVar1 == 0) {
      l = (LOGGER_LOG)OptionHandler_Clone((OPTIONHANDLER_HANDLE)result);
    }
    else {
      iVar1 = strcmp((char *)value_local,"TrustedCerts");
      if (iVar1 == 0) {
        iVar1 = mallocAndStrcpy_s((char **)&l,(char *)result);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                      ,"tlsio_openssl_CloneOption",0x74,1,
                      "unable to mallocAndStrcpy_s TrustedCerts value");
          }
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        iVar1 = strcmp((char *)value_local,"CipherSuite");
        if (iVar1 == 0) {
          iVar1 = mallocAndStrcpy_s((char **)&l,(char *)result);
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                        ,"tlsio_openssl_CloneOption",0x80,1,
                        "unable to mallocAndStrcpy_s CipherSuite value");
            }
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          iVar1 = strcmp((char *)value_local,"x509certificate");
          if (iVar1 == 0) {
            iVar1 = mallocAndStrcpy_s((char **)&l,(char *)result);
            if (iVar1 != 0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                          ,"tlsio_openssl_CloneOption",0x8c,1,
                          "unable to mallocAndStrcpy_s x509certificate value");
              }
              l = (LOGGER_LOG)0x0;
            }
          }
          else {
            iVar1 = strcmp((char *)value_local,"x509privatekey");
            if (iVar1 == 0) {
              iVar1 = mallocAndStrcpy_s((char **)&l,(char *)result);
              if (iVar1 != 0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                            ,"tlsio_openssl_CloneOption",0x98,1,
                            "unable to mallocAndStrcpy_s x509privatekey value");
                }
                l = (LOGGER_LOG)0x0;
              }
            }
            else {
              iVar1 = strcmp((char *)value_local,"x509EccCertificate");
              if (iVar1 == 0) {
                iVar1 = mallocAndStrcpy_s((char **)&l,(char *)result);
                if (iVar1 != 0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                              ,"tlsio_openssl_CloneOption",0xa4,1,
                              "unable to mallocAndStrcpy_s x509EccCertificate value");
                  }
                  l = (LOGGER_LOG)0x0;
                }
              }
              else {
                iVar1 = strcmp((char *)value_local,"x509EccAliasKey");
                if (iVar1 == 0) {
                  iVar1 = mallocAndStrcpy_s((char **)&l,(char *)result);
                  if (iVar1 != 0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                                ,"tlsio_openssl_CloneOption",0xb0,1,
                                "unable to mallocAndStrcpy_s x509EccKey value");
                    }
                    l = (LOGGER_LOG)0x0;
                  }
                }
                else {
                  iVar1 = strcmp((char *)value_local,"tls_version");
                  if (iVar1 == 0) {
                    if (*result == 10) {
                      l_7._4_4_ = 10;
                    }
                    else if (*result == 0xb) {
                      l_7._4_4_ = 0xb;
                    }
                    else if (*result == 0xc) {
                      l_7._4_4_ = 0xc;
                    }
                    else {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                                  ,"tlsio_openssl_CloneOption",0xca,1,
                                  "Unexpected TLS version value (%d)",CONCAT44(uVar3,*result));
                      }
                      l_7._4_4_ = -1;
                    }
                    if (l_7._4_4_ < 0) {
                      l = (LOGGER_LOG)0x0;
                    }
                    else {
                      p_Var2 = (LOGGER_LOG)malloc(4);
                      l = p_Var2;
                      if (p_Var2 == (LOGGER_LOG)0x0) {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                                    ,"tlsio_openssl_CloneOption",0xd8,1,
                                    "Failed cloning tls_version option");
                        }
                      }
                      else {
                        *(int *)p_Var2 = l_7._4_4_;
                      }
                    }
                  }
                  else {
                    iVar1 = strcmp((char *)value_local,"tls_validation_callback");
                    if ((iVar1 == 0) ||
                       (iVar1 = strcmp((char *)value_local,"tls_validation_callback_data"),
                       iVar1 == 0)) {
                      l = (LOGGER_LOG)result;
                    }
                    else {
                      iVar1 = strcmp((char *)value_local,"Engine");
                      if (iVar1 == 0) {
                        iVar1 = mallocAndStrcpy_s((char **)&l,(char *)result);
                        if (iVar1 != 0) {
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            (*p_Var2)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                                      ,"tlsio_openssl_CloneOption",0xed,1,
                                      "unable to mallocAndStrcpy_s Engine value");
                          }
                          l = (LOGGER_LOG)0x0;
                        }
                      }
                      else {
                        iVar1 = strcmp((char *)value_local,"x509PrivatekeyType");
                        if (iVar1 == 0) {
                          uVar3 = *result;
                          p_Var2 = (LOGGER_LOG)malloc(4);
                          l = p_Var2;
                          if (p_Var2 == (LOGGER_LOG)0x0) {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              (*p_Var2)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                                        ,"tlsio_openssl_CloneOption",0xfc,1,
                                        "Failed cloning cert or private key option");
                            }
                          }
                          else {
                            *(undefined4 *)p_Var2 = uVar3;
                          }
                        }
                        else {
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            (*p_Var2)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                                      ,"tlsio_openssl_CloneOption",0x107,1,"not handled option : %s"
                                      ,value_local);
                          }
                          l = (LOGGER_LOG)0x0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return l;
}

Assistant:

static void* tlsio_openssl_CloneOption(const char* name, const void* value)
{
    void* result;
    if (
        (name == NULL) || (value == NULL)
        )
    {
        LogError("invalid parameter detected: const char* name=%p, const void* value=%p", name, value);
        result = NULL;
    }
    else
    {
        if (strcmp(name, OPTION_UNDERLYING_IO_OPTIONS) == 0)
        {
            result = (void*)OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
        }
        else if (strcmp(name, OPTION_TRUSTED_CERT) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s TrustedCerts value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_OPENSSL_CIPHER_SUITE) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s CipherSuite value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, SU_OPTION_X509_CERT) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509certificate value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, SU_OPTION_X509_PRIVATE_KEY) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509privatekey value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_X509_ECC_CERT) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509EccCertificate value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_X509_ECC_KEY) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509EccKey value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_TLS_VERSION) == 0)
        {
            int int_value;

            if (*(TLSIO_VERSION*)value == VERSION_1_0)
            {
                int_value = 10;
            }
            else if (*(TLSIO_VERSION*)value == VERSION_1_1)
            {
                int_value = 11;
            }
            else if (*(TLSIO_VERSION*)value == VERSION_1_2)
            {
                int_value = 12;
            }
            else
            {
                LogError("Unexpected TLS version value (%d)", *(int*)value);
                int_value = -1;
            }

            if (int_value < 0)
            {
                result = NULL;
            }
            else
            {
                int* value_clone;

                if ((value_clone = (int*)malloc(sizeof(int))) == NULL)
                {
                    LogError("Failed cloning tls_version option");
                }
                else
                {
                    *value_clone = int_value;
                }

                result = value_clone;
            }
        }
        else if (
            (strcmp(name, "tls_validation_callback") == 0) ||
            (strcmp(name, "tls_validation_callback_data") == 0)
            )
        {
            result = (void*)value;
        }
        else if (strcmp(name, OPTION_OPENSSL_ENGINE) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s Engine value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_OPENSSL_PRIVATE_KEY_TYPE) == 0)
        {
            OPTION_OPENSSL_KEY_TYPE key_type_value = *((OPTION_OPENSSL_KEY_TYPE*)value);
            OPTION_OPENSSL_KEY_TYPE* value_clone;

            if ((value_clone = (OPTION_OPENSSL_KEY_TYPE*)malloc(sizeof(OPTION_OPENSSL_KEY_TYPE))) == NULL)
            {
                LogError("Failed cloning cert or private key option");
            }
            else
            {
                *value_clone = key_type_value;
            }

            result = value_clone;
        }
        else
        {
            LogError("not handled option : %s", name);
            result = NULL;
        }
    }
    return result;
}